

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOReadKeyValue(FmsIOContext *ctx,char *key,char *value)

{
  char *pcVar1;
  ulong __n;
  size_t __n_00;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  char *key_end;
  FmsInt N;
  char buff [1024];
  char local_428 [1032];
  void *local_20;
  void *local_18;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    pcVar1 = fgets(local_428,0x400,(FILE *)*in_RDI);
    if (pcVar1 == (char *)0x0) {
      local_4 = 2;
    }
    else {
      pcVar1 = strchr(local_428,0x3a);
      if (pcVar1 == (char *)0x0) {
        local_4 = 3;
      }
      else {
        if (local_18 != (void *)0x0) {
          __n = (long)pcVar1 - (long)local_428;
          if (0x1ff < __n) {
            return 4;
          }
          memcpy(local_18,local_428,__n);
          *(undefined1 *)((long)local_18 + __n) = 0;
        }
        if (local_20 != (void *)0x0) {
          __n_00 = strlen(pcVar1 + 2);
          if (0x1ff < __n_00) {
            return 5;
          }
          memcpy(local_20,pcVar1 + 2,__n_00);
          *(undefined1 *)((long)local_20 + (__n_00 - 1)) = 0;
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOReadKeyValue(FmsIOContext *ctx, char *key, char *value) {
  char buff[FMS_BUFFER_SIZE * 2];
  FmsInt N = 0;
  char *key_end = NULL;
  if(!ctx) E_RETURN(1);
  if(fgets(buff, FMS_BUFFER_SIZE * 2, ctx->fp) == NULL)
    return 2;   // This could mean EoF which is not always an error.
  if((key_end = strchr(buff, ':')) == NULL)
    E_RETURN(3);

  if(key) {
    N = key_end - buff;
    if(N >= FMS_BUFFER_SIZE)
      E_RETURN(4);
    memcpy(key, buff, N);
    key[N] = '\0';
  }

  // After the ':' is a space then the value starts
  if(value) {
    N = strlen(key_end+2);
    if(N >= FMS_BUFFER_SIZE)
      E_RETURN(5);
    // Remove the \n from the end
    memcpy(value, key_end+2, N);
    value[N-1] = '\0';
    // value[N] = '\0';
  }
  return 0;
}